

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O3

void __thiscall
VW::config::options_serializer_boost_po::serialize<std::__cxx11::string>
          (options_serializer_boost_po *this,
          typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *typed_option)

{
  element_type *peVar1;
  pointer pcVar2;
  ostream *poVar3;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x18," --",3);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->field_0x18,
                      (typed_option->super_base_option).m_name._M_dataplus._M_p,
                      (typed_option->super_base_option).m_name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  peVar1 = (typed_option->m_value).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_38 = local_28;
  if (peVar1 == (element_type *)0x0) {
    local_30 = 0;
    local_28[0] = '\0';
  }
  else {
    pcVar2 = (peVar1->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar2,pcVar2 + peVar1->_M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

void serialize(typed_option<T> typed_option)
  {
    m_output_stream << " --" << typed_option.m_name << " " << typed_option.value();
  }